

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O2

void QDBusMenuItem::registerDBusTypes(void)

{
  qDBusRegisterMetaType<QDBusMenuItem>();
  qDBusRegisterMetaType<QList<QDBusMenuItem>>();
  qDBusRegisterMetaType<QDBusMenuItemKeys>();
  qDBusRegisterMetaType<QList<QDBusMenuItemKeys>>();
  qDBusRegisterMetaType<QDBusMenuLayoutItem>();
  qDBusRegisterMetaType<QList<QDBusMenuLayoutItem>>();
  qDBusRegisterMetaType<QDBusMenuEvent>();
  qDBusRegisterMetaType<QList<QDBusMenuEvent>>();
  qDBusRegisterMetaType<QList<QList<QString>>>();
  return;
}

Assistant:

void QDBusMenuItem::registerDBusTypes()
{
    qDBusRegisterMetaType<QDBusMenuItem>();
    qDBusRegisterMetaType<QDBusMenuItemList>();
    qDBusRegisterMetaType<QDBusMenuItemKeys>();
    qDBusRegisterMetaType<QDBusMenuItemKeysList>();
    qDBusRegisterMetaType<QDBusMenuLayoutItem>();
    qDBusRegisterMetaType<QDBusMenuLayoutItemList>();
    qDBusRegisterMetaType<QDBusMenuEvent>();
    qDBusRegisterMetaType<QDBusMenuEventList>();
    qDBusRegisterMetaType<QDBusMenuShortcut>();
}